

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::Read3dmChunkVersion(ON_BinaryArchive *this,int *major_version,int *minor_version)

{
  ulong in_RAX;
  size_t sVar1;
  uchar v;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  sVar1 = Read(this,1,(void *)((long)&uStack_18 + 7));
  if (minor_version != (int *)0x0) {
    *minor_version = uStack_18._7_1_ & 0xf;
  }
  if (major_version != (int *)0x0) {
    *major_version = (uint)(uStack_18._7_1_ >> 4);
  }
  return sVar1 == 1;
}

Assistant:

bool ON_BinaryArchive::Read3dmChunkVersion(
  int* major_version, // major // 0 to 15
  int* minor_version // minor // 0 to 16
  )
{
  unsigned char v = 0;
  bool rc = ReadChar( &v );
  if ( minor_version) *minor_version = v%16;
  // The bit shift happens on the fly in the following
  // if statement.  It was happening twice which always
  // set the major version to 0
  //v >>= 4;
  if ( major_version) *major_version = (v>>4);
  return rc;
}